

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
::reject(AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
         *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> local_1f8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::ExceptionOr(&local_1f8,false,exception_00);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::operator=(&this->result,&local_1f8);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr(&local_1f8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }